

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O0

BinaryOperator slang::ast::OpInfo::getBinary(SyntaxKind kind)

{
  SyntaxKind kind_local;
  undefined4 local_4;
  
  if (kind == AddAssignmentExpression) {
    local_4 = Add;
  }
  else if (kind == AddExpression) {
    local_4 = Add;
  }
  else if (kind == AndAssignmentExpression) {
    local_4 = BinaryAnd;
  }
  else if (kind == ArithmeticLeftShiftAssignmentExpression) {
    local_4 = ArithmeticShiftLeft;
  }
  else if (kind == ArithmeticRightShiftAssignmentExpression) {
    local_4 = ArithmeticShiftRight;
  }
  else if (kind == ArithmeticShiftLeftExpression) {
    local_4 = ArithmeticShiftLeft;
  }
  else if (kind == ArithmeticShiftRightExpression) {
    local_4 = ArithmeticShiftRight;
  }
  else if (kind == BinaryAndExpression) {
    local_4 = BinaryAnd;
  }
  else if (kind == BinaryOrExpression) {
    local_4 = BinaryOr;
  }
  else if (kind == BinaryXnorExpression) {
    local_4 = BinaryXnor;
  }
  else if (kind == BinaryXorExpression) {
    local_4 = BinaryXor;
  }
  else if (kind == CaseEqualityExpression) {
    local_4 = CaseEquality;
  }
  else if (kind == CaseInequalityExpression) {
    local_4 = CaseInequality;
  }
  else if (kind == DivideAssignmentExpression) {
    local_4 = Divide;
  }
  else if (kind == DivideExpression) {
    local_4 = Divide;
  }
  else if (kind == EqualityExpression) {
    local_4 = Equality;
  }
  else if (kind == GreaterThanEqualExpression) {
    local_4 = GreaterThanEqual;
  }
  else if (kind == GreaterThanExpression) {
    local_4 = GreaterThan;
  }
  else if (kind == InequalityExpression) {
    local_4 = Inequality;
  }
  else if (kind == LessThanEqualExpression) {
    local_4 = LessThanEqual;
  }
  else if (kind == LessThanExpression) {
    local_4 = LessThan;
  }
  else if (kind == LogicalAndExpression) {
    local_4 = LogicalAnd;
  }
  else if (kind == LogicalEquivalenceExpression) {
    local_4 = LogicalEquivalence;
  }
  else if (kind == LogicalImplicationExpression) {
    local_4 = LogicalImplication;
  }
  else if (kind == LogicalLeftShiftAssignmentExpression) {
    local_4 = LogicalShiftLeft;
  }
  else if (kind == LogicalOrExpression) {
    local_4 = LogicalOr;
  }
  else if (kind == LogicalRightShiftAssignmentExpression) {
    local_4 = LogicalShiftRight;
  }
  else if (kind == LogicalShiftLeftExpression) {
    local_4 = LogicalShiftLeft;
  }
  else if (kind == LogicalShiftRightExpression) {
    local_4 = LogicalShiftRight;
  }
  else if (kind == ModAssignmentExpression) {
    local_4 = Mod;
  }
  else if (kind == ModExpression) {
    local_4 = Mod;
  }
  else if (kind == MultiplyAssignmentExpression) {
    local_4 = Multiply;
  }
  else if (kind == MultiplyExpression) {
    local_4 = Multiply;
  }
  else if (kind == OrAssignmentExpression) {
    local_4 = BinaryOr;
  }
  else if (kind == PowerExpression) {
    local_4 = Power;
  }
  else if (kind == SubtractAssignmentExpression) {
    local_4 = Subtract;
  }
  else if (kind == SubtractExpression) {
    local_4 = Subtract;
  }
  else if (kind == WildcardEqualityExpression) {
    local_4 = WildcardEquality;
  }
  else if (kind == WildcardInequalityExpression) {
    local_4 = WildcardInequality;
  }
  else {
    local_4 = BinaryXor;
  }
  return local_4;
}

Assistant:

BinaryOperator OpInfo::getBinary(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AddExpression:
            return BinaryOperator::Add;
        case SyntaxKind::SubtractExpression:
            return BinaryOperator::Subtract;
        case SyntaxKind::MultiplyExpression:
            return BinaryOperator::Multiply;
        case SyntaxKind::DivideExpression:
            return BinaryOperator::Divide;
        case SyntaxKind::ModExpression:
            return BinaryOperator::Mod;
        case SyntaxKind::BinaryAndExpression:
            return BinaryOperator::BinaryAnd;
        case SyntaxKind::BinaryOrExpression:
            return BinaryOperator::BinaryOr;
        case SyntaxKind::BinaryXorExpression:
            return BinaryOperator::BinaryXor;
        case SyntaxKind::BinaryXnorExpression:
            return BinaryOperator::BinaryXnor;
        case SyntaxKind::EqualityExpression:
            return BinaryOperator::Equality;
        case SyntaxKind::InequalityExpression:
            return BinaryOperator::Inequality;
        case SyntaxKind::CaseEqualityExpression:
            return BinaryOperator::CaseEquality;
        case SyntaxKind::CaseInequalityExpression:
            return BinaryOperator::CaseInequality;
        case SyntaxKind::GreaterThanEqualExpression:
            return BinaryOperator::GreaterThanEqual;
        case SyntaxKind::GreaterThanExpression:
            return BinaryOperator::GreaterThan;
        case SyntaxKind::LessThanEqualExpression:
            return BinaryOperator::LessThanEqual;
        case SyntaxKind::LessThanExpression:
            return BinaryOperator::LessThan;
        case SyntaxKind::WildcardEqualityExpression:
            return BinaryOperator::WildcardEquality;
        case SyntaxKind::WildcardInequalityExpression:
            return BinaryOperator::WildcardInequality;
        case SyntaxKind::LogicalAndExpression:
            return BinaryOperator::LogicalAnd;
        case SyntaxKind::LogicalOrExpression:
            return BinaryOperator::LogicalOr;
        case SyntaxKind::LogicalImplicationExpression:
            return BinaryOperator::LogicalImplication;
        case SyntaxKind::LogicalEquivalenceExpression:
            return BinaryOperator::LogicalEquivalence;
        case SyntaxKind::LogicalShiftLeftExpression:
            return BinaryOperator::LogicalShiftLeft;
        case SyntaxKind::LogicalShiftRightExpression:
            return BinaryOperator::LogicalShiftRight;
        case SyntaxKind::ArithmeticShiftLeftExpression:
            return BinaryOperator::ArithmeticShiftLeft;
        case SyntaxKind::ArithmeticShiftRightExpression:
            return BinaryOperator::ArithmeticShiftRight;
        case SyntaxKind::PowerExpression:
            return BinaryOperator::Power;
        case SyntaxKind::AddAssignmentExpression:
            return BinaryOperator::Add;
        case SyntaxKind::SubtractAssignmentExpression:
            return BinaryOperator::Subtract;
        case SyntaxKind::MultiplyAssignmentExpression:
            return BinaryOperator::Multiply;
        case SyntaxKind::DivideAssignmentExpression:
            return BinaryOperator::Divide;
        case SyntaxKind::ModAssignmentExpression:
            return BinaryOperator::Mod;
        case SyntaxKind::AndAssignmentExpression:
            return BinaryOperator::BinaryAnd;
        case SyntaxKind::OrAssignmentExpression:
            return BinaryOperator::BinaryOr;
        case SyntaxKind::XorAssignmentExpression:
            return BinaryOperator::BinaryXor;
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
            return BinaryOperator::LogicalShiftLeft;
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
            return BinaryOperator::LogicalShiftRight;
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
            return BinaryOperator::ArithmeticShiftLeft;
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
            return BinaryOperator::ArithmeticShiftRight;
        default:
            SLANG_UNREACHABLE;
    }
}